

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O2

pair<long,_long> pstore::utf::slice(czstring str,ptrdiff_t start,ptrdiff_t end)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  size_t pos;
  char *last;
  pair<long,_long> pVar6;
  pair<long,_long> pVar7;
  
  if (str != (czstring)0x0) {
    sVar1 = strlen(str);
    last = str + sVar1;
    if (start < 1) {
      start = 0;
    }
    pcVar2 = index<char_const*>(str,last,start);
    pos = 0;
    if (0 < end) {
      pos = end;
    }
    pcVar3 = index<char_const*>(str,last,pos);
    lVar4 = (long)pcVar2 - (long)str;
    if (pcVar2 == last) {
      lVar4 = -1;
    }
    lVar5 = (long)pcVar3 - (long)str;
    if (pcVar3 == last) {
      lVar5 = -1;
    }
    pVar6.second = lVar5;
    pVar6.first = lVar4;
    return pVar6;
  }
  pVar7.second = -1;
  pVar7.first = -1;
  return pVar7;
}

Assistant:

auto slice (gsl::czstring const str, std::ptrdiff_t const start, std::ptrdiff_t const end)
            -> std::pair<std::ptrdiff_t, std::ptrdiff_t> {

            if (str == nullptr) {
                return std::make_pair (-1, -1);
            }

            auto const * const first = str;
            auto const * const last = str + strlen (str);
            gsl::czstring p1 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, start)));
            gsl::czstring p2 =
                index (first, last, static_cast<std::size_t> (std::max (std::ptrdiff_t{0}, end)));
            return std::make_pair ((p1 != last) ? p1 - str : -1, (p2 != last) ? p2 - str : -1);
        }